

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptBlockData.cpp
# Opt level: O2

void __thiscall
GlobOptBlockData::MergeBlockData
          (GlobOptBlockData *this,BasicBlock *toBlock,BasicBlock *fromBlock,
          BVSparse<Memory::JitArenaAllocator> *symsRequiringCompensation,
          BVSparse<Memory::JitArenaAllocator> *symsCreatedForMerge,bool forceTypeSpecOnLoopHeader)

{
  SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount> *pSVar1
  ;
  GlobOptBlockData *fromData;
  StackLiteralInitFldData *value;
  ushort uVar2;
  uint uVar3;
  BVIndex BVar4;
  Type TVar5;
  int iVar6;
  CapturedValues *pCVar7;
  CapturedValues *this_00;
  CapturedValues *pCVar8;
  StackSym *pSVar9;
  SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
  *pSVar10;
  Type pJVar11;
  Loop *pLVar12;
  SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount> *other;
  StackLiteralInitFldDataMap *this_01;
  Type pSVar13;
  long lVar14;
  code *pcVar15;
  bool bVar16;
  int iVar17;
  Type ppBVar18;
  Type *pTVar19;
  Type *pTVar20;
  Iterator *pIVar21;
  Type *pTVar22;
  Type *pTVar23;
  Value *pVVar24;
  Value *pVVar25;
  StackSym *pSVar26;
  BVSparse<Memory::JitArenaAllocator> *pBVar27;
  BaseDictionary<StackSym_*,_StackLiteralInitFldData,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *pBVar28;
  undefined8 *puVar29;
  ulong uVar30;
  int iVar31;
  ValueType *this_02;
  SymID id;
  StackLiteralInitFldDataMap *toMap;
  CapturedValues *pCVar32;
  Type_conflict pBVar33;
  undefined1 auStack_d8 [8];
  Iterator iterFrom;
  BVSparse<Memory::JitArenaAllocator> *local_b8;
  undefined1 auStack_a8 [8];
  BVSparse<Memory::JitArenaAllocator> tempBv3;
  undefined1 auStack_78 [8];
  Iterator iterFrom_1;
  undefined1 auStack_58 [8];
  BVSparse<Memory::JitArenaAllocator> tempBv1;
  
  fromData = &fromBlock->globOptData;
  tempBv1.lastUsedNodePrevNextField = &symsCreatedForMerge->head;
  bVar16 = GlobOpt::DoBoundCheckHoist(this->globOpt);
  if (bVar16) {
    GlobOpt::MergeBoundCheckHoistBlockData(this->globOpt,toBlock,this,fromBlock,fromData);
  }
  uVar2 = *(ushort *)&toBlock->field_0x18;
  MergeValueMaps(this,toBlock,fromBlock,symsRequiringCompensation,
                 (BVSparse<Memory::JitArenaAllocator> *)tempBv1.lastUsedNodePrevNextField);
  GlobOpt::InsertCloneStrs(this->globOpt,toBlock,this,fromData);
  BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::And>
            (this->liveFields,(fromBlock->globOptData).liveFields);
  BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::And>
            (this->liveArrayValues,(fromBlock->globOptData).liveArrayValues);
  BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::And>
            (this->isTempSrc,(fromBlock->globOptData).isTempSrc);
  this->hasCSECandidates =
       (bool)(this->hasCSECandidates & (fromBlock->globOptData).hasCSECandidates);
  BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::Or>
            (this->changedSyms,(fromBlock->globOptData).changedSyms);
  pCVar7 = this->capturedValues;
  this_00 = (fromBlock->globOptData).capturedValues;
  if (pCVar7 == (CapturedValues *)0x0) {
    this->capturedValues = this_00;
    if (this_00 != (CapturedValues *)0x0) {
      CapturedValues::IncrementRefCount(this_00);
    }
  }
  else {
    tempBv3.head = (Type_conflict)
                   (pCVar7->constantValues).super_SListNodeBase<Memory::ArenaAllocator>.next;
    pCVar32 = (CapturedValues *)0x0;
    bVar16 = (CapturedValues *)tempBv3.head != pCVar7;
    if (!bVar16) {
      tempBv3.head = (Type_conflict)pCVar32;
    }
    iterFrom.list = &this_00->constantValues;
    if (this_00 != (CapturedValues *)0x0) {
      pCVar8 = (CapturedValues *)
               (this_00->constantValues).super_SListNodeBase<Memory::ArenaAllocator>.next;
      pCVar32 = (CapturedValues *)(ulong)(pCVar8 != this_00);
      iterFrom.list =
           (SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
            *)0x0;
      if (pCVar8 != this_00) {
        iterFrom.list =
             (SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
              *)pCVar8;
      }
    }
    auStack_d8 = (undefined1  [8])this_00;
    auStack_a8 = (undefined1  [8])pCVar7;
    ppBVar18 = (Type)__tls_get_addr(&PTR_013e5f18);
    tempBv1.lastUsedNodePrevNextField = ppBVar18;
    while( true ) {
      if ((pCVar32 == (CapturedValues *)0x0) || (!bVar16)) break;
      pTVar19 = SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
                ::Iterator::Data((Iterator *)auStack_d8);
      pSVar26 = pTVar19->key;
      pTVar19 = SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
                ::Iterator::Data((Iterator *)auStack_a8);
      pSVar9 = pTVar19->key;
      uVar3 = (pSVar26->super_Sym).m_id;
      BVar4 = (pSVar9->super_Sym).m_id;
      if (uVar3 < BVar4) {
        BVSparse<Memory::JitArenaAllocator>::Set(this->changedSyms,uVar3);
        ppBVar18 = tempBv1.lastUsedNodePrevNextField;
        if (iterFrom.list ==
            (SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
             *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *(undefined4 *)ppBVar18 = 1;
          bVar16 = Js::Throw::ReportAssert
                             ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                              ,0x76,"(current != nullptr)","current != nullptr");
          if (!bVar16) goto LAB_004632b3;
          *(undefined4 *)ppBVar18 = 0;
        }
        iterFrom.list =
             (SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
              *)((iterFrom.list)->super_SListNodeBase<Memory::ArenaAllocator>).next;
        pCVar32 = (CapturedValues *)(ulong)((undefined1  [8])iterFrom.list != auStack_d8);
        if ((undefined1  [8])iterFrom.list == auStack_d8) {
          iterFrom.list =
               (SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
                *)0x0;
        }
        bVar16 = true;
      }
      else if (BVar4 < uVar3) {
        BVSparse<Memory::JitArenaAllocator>::Set(this->changedSyms,BVar4);
        ppBVar18 = tempBv1.lastUsedNodePrevNextField;
        if (tempBv3.head == (Type_conflict)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *(undefined4 *)ppBVar18 = 1;
          bVar16 = Js::Throw::ReportAssert
                             ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                              ,0x76,"(current != nullptr)","current != nullptr");
          if (!bVar16) goto LAB_004632b3;
          *(undefined4 *)ppBVar18 = 0;
        }
        tempBv3.head = (tempBv3.head)->next;
        bVar16 = (undefined1  [8])tempBv3.head != auStack_a8;
        if (!bVar16) {
          tempBv3.head = (Type_conflict)0x0;
        }
        pCVar32 = (CapturedValues *)&DAT_00000001;
      }
      else {
        pTVar19 = SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
                  ::Iterator::Data((Iterator *)auStack_d8);
        pTVar20 = SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
                  ::Iterator::Data((Iterator *)auStack_a8);
        if ((pTVar19->key->super_Sym).m_id != (pTVar20->key->super_Sym).m_id) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          ppBVar18 = tempBv1.lastUsedNodePrevNextField;
          *(undefined4 *)tempBv1.lastUsedNodePrevNextField = 1;
          bVar16 = Js::Throw::ReportAssert
                             ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBlockData.cpp"
                              ,0x1d1,"(symValueFrom->Key()->m_id == symValueTo->Key()->m_id)",
                              "symValueFrom->Key()->m_id == symValueTo->Key()->m_id");
          if (!bVar16) goto LAB_004632b3;
          *(undefined4 *)ppBVar18 = 0;
        }
        tempBv1.head = *(Type_conflict *)&(pTVar19->value).u;
        auStack_58[0] = (pTVar19->value).type;
        iterFrom_1.list =
             *(SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
               **)&(pTVar20->value).u;
        auStack_78[0] = (pTVar20->value).type;
        bVar16 = BailoutConstantValue::IsEqual
                           ((BailoutConstantValue *)auStack_58,(BailoutConstantValue *)auStack_78);
        if (!bVar16) {
          BVSparse<Memory::JitArenaAllocator>::Set(this->changedSyms,(pSVar9->super_Sym).m_id);
        }
        ppBVar18 = tempBv1.lastUsedNodePrevNextField;
        if (iterFrom.list ==
            (SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
             *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *(undefined4 *)ppBVar18 = 1;
          bVar16 = Js::Throw::ReportAssert
                             ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                              ,0x76,"(current != nullptr)","current != nullptr");
          if (!bVar16) goto LAB_004632b3;
          *(undefined4 *)ppBVar18 = 0;
        }
        iterFrom.list =
             (SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
              *)((iterFrom.list)->super_SListNodeBase<Memory::ArenaAllocator>).next;
        bVar16 = (undefined1  [8])iterFrom.list != auStack_d8;
        if (!bVar16) {
          iterFrom.list =
               (SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
                *)0x0;
        }
        pCVar32 = (CapturedValues *)(ulong)bVar16;
        if (tempBv3.head == (Type_conflict)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *(undefined4 *)ppBVar18 = 1;
          bVar16 = Js::Throw::ReportAssert
                             ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                              ,0x76,"(current != nullptr)","current != nullptr");
          if (!bVar16) goto LAB_004632b3;
          *(undefined4 *)ppBVar18 = 0;
        }
        bVar16 = (undefined1  [8])(tempBv3.head)->next != auStack_a8;
        tempBv3.head = (Type_conflict)(tempBv3.head)->next;
        if (!bVar16) {
          tempBv3.head = (Type_conflict)(CapturedValues *)0x0;
        }
      }
    }
    if (bVar16 || (char)pCVar32 != '\0') {
      pIVar21 = (Iterator *)auStack_a8;
      if (pCVar32 != (CapturedValues *)0x0) {
        pIVar21 = (Iterator *)auStack_d8;
      }
      auStack_58 = (undefined1  [8])pIVar21->list;
      tempBv1.head = (Type_conflict)pIVar21->current;
      do {
        pTVar19 = SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
                  ::Iterator::Data((Iterator *)auStack_58);
        BVSparse<Memory::JitArenaAllocator>::Set(this->changedSyms,(pTVar19->key->super_Sym).m_id);
        if (tempBv1.head == (Type_conflict)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *(undefined4 *)ppBVar18 = 1;
          bVar16 = Js::Throw::ReportAssert
                             ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                              ,0x76,"(current != nullptr)","current != nullptr");
          if (!bVar16) goto LAB_004632b3;
          *(undefined4 *)ppBVar18 = 0;
        }
        tempBv1.head = (tempBv1.head)->next;
      } while ((undefined1  [8])tempBv1.head != auStack_58);
    }
    pCVar7 = (fromBlock->globOptData).capturedValues;
    pSVar1 = &pCVar7->copyPropSyms;
    auStack_78 = (undefined1  [8])pSVar1;
    if (pCVar7 == (CapturedValues *)0x0) {
      auStack_78 = (undefined1  [8])0x0;
    }
    auStack_58 = (undefined1  [8])&this->capturedValues->copyPropSyms;
    iterFrom_1.list =
         (SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
          *)auStack_78;
    tempBv1.head = (Type_conflict)
                   (this->capturedValues->copyPropSyms).super_SListNodeBase<Memory::ArenaAllocator>.
                   next;
    pBVar33 = (Type_conflict)0x0;
    bVar16 = (undefined1  [8])tempBv1.head != auStack_58;
    if (!bVar16) {
      tempBv1.head = pBVar33;
    }
    if (pCVar7 != (CapturedValues *)0x0) {
      pSVar10 = (SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
                 *)(pSVar1->super_SListNodeBase<Memory::ArenaAllocator>).next;
      pBVar33 = (Type_conflict)(ulong)(pSVar10 != pSVar1);
      iterFrom_1.list =
           (SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
            *)0x0;
      if (pSVar10 != pSVar1) {
        iterFrom_1.list = pSVar10;
      }
    }
    while ((pBVar33 != (Type_conflict)0x0 && (bVar16))) {
      pTVar22 = SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
                ::Iterator::Data((Iterator *)auStack_78);
      pSVar26 = pTVar22->key;
      pTVar22 = SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
                ::Iterator::Data((Iterator *)auStack_58);
      ppBVar18 = tempBv1.lastUsedNodePrevNextField;
      pSVar9 = pTVar22->key;
      uVar3 = (pSVar26->super_Sym).m_id;
      BVar4 = (pSVar9->super_Sym).m_id;
      if (uVar3 < BVar4) {
        BVSparse<Memory::JitArenaAllocator>::Set(this->changedSyms,uVar3);
        ppBVar18 = tempBv1.lastUsedNodePrevNextField;
        if (iterFrom_1.list ==
            (SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
             *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *(undefined4 *)ppBVar18 = 1;
          bVar16 = Js::Throw::ReportAssert
                             ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                              ,0x76,"(current != nullptr)","current != nullptr");
          if (!bVar16) goto LAB_004632b3;
          *(undefined4 *)ppBVar18 = 0;
        }
        iterFrom_1.list =
             (SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
              *)((iterFrom_1.list)->super_SListNodeBase<Memory::ArenaAllocator>).next;
        pBVar33 = (Type_conflict)(ulong)((undefined1  [8])iterFrom_1.list != auStack_78);
        if ((undefined1  [8])iterFrom_1.list == auStack_78) {
          iterFrom_1.list =
               (SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
                *)0x0;
        }
        bVar16 = true;
      }
      else if (BVar4 < uVar3) {
        BVSparse<Memory::JitArenaAllocator>::Set(this->changedSyms,BVar4);
        if (tempBv1.head == (Type_conflict)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *(undefined4 *)ppBVar18 = 1;
          bVar16 = Js::Throw::ReportAssert
                             ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                              ,0x76,"(current != nullptr)","current != nullptr");
          if (!bVar16) goto LAB_004632b3;
          *(undefined4 *)ppBVar18 = 0;
        }
        tempBv1.head = (tempBv1.head)->next;
        bVar16 = (undefined1  [8])tempBv1.head != auStack_58;
        if (!bVar16) {
          tempBv1.head = (Type_conflict)0x0;
        }
        pBVar33 = (Type_conflict)&DAT_00000001;
      }
      else {
        pTVar22 = SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
                  ::Iterator::Data((Iterator *)auStack_78);
        pTVar23 = SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
                  ::Iterator::Data((Iterator *)auStack_58);
        if ((pTVar22->key->super_Sym).m_id != (pTVar23->key->super_Sym).m_id) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *(undefined4 *)ppBVar18 = 1;
          bVar16 = Js::Throw::ReportAssert
                             ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBlockData.cpp"
                              ,0x1da,"(copyPropSymFrom->Key()->m_id == copyPropSymTo->Key()->m_id)",
                              "copyPropSymFrom->Key()->m_id == copyPropSymTo->Key()->m_id");
          if (!bVar16) goto LAB_004632b3;
          *(undefined4 *)ppBVar18 = 0;
        }
        if ((pTVar22->value->super_Sym).m_id == (pTVar23->value->super_Sym).m_id) {
          pVVar24 = FindValue(fromData,&pTVar22->key->super_Sym);
          pVVar25 = FindValue(this,&pTVar22->key->super_Sym);
          if ((pVVar25 == (Value *)0x0 || pVVar24 == (Value *)0x0) ||
             (pVVar24->valueNumber != pVVar25->valueNumber)) goto LAB_004626ad;
        }
        else {
LAB_004626ad:
          BVSparse<Memory::JitArenaAllocator>::Set(this->changedSyms,(pSVar9->super_Sym).m_id);
        }
        if (iterFrom_1.list ==
            (SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
             *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *(undefined4 *)ppBVar18 = 1;
          bVar16 = Js::Throw::ReportAssert
                             ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                              ,0x76,"(current != nullptr)","current != nullptr");
          if (!bVar16) goto LAB_004632b3;
          *(undefined4 *)ppBVar18 = 0;
        }
        iterFrom_1.list =
             (SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
              *)((iterFrom_1.list)->super_SListNodeBase<Memory::ArenaAllocator>).next;
        bVar16 = (undefined1  [8])iterFrom_1.list != auStack_78;
        if (!bVar16) {
          iterFrom_1.list =
               (SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
                *)0x0;
        }
        pBVar33 = (Type_conflict)(ulong)bVar16;
        if (tempBv1.head == (Type_conflict)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *(undefined4 *)ppBVar18 = 1;
          bVar16 = Js::Throw::ReportAssert
                             ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                              ,0x76,"(current != nullptr)","current != nullptr");
          if (!bVar16) goto LAB_004632b3;
          *(undefined4 *)ppBVar18 = 0;
        }
        bVar16 = (undefined1  [8])(tempBv1.head)->next != auStack_58;
        tempBv1.head = (Type_conflict)(tempBv1.head)->next;
        if (!bVar16) {
          tempBv1.head = (Type_conflict)(StackSym *)0x0;
        }
      }
    }
    if (bVar16 || (char)pBVar33 != '\0') {
      puVar29 = (undefined8 *)auStack_58;
      if (pBVar33 != (Type_conflict)0x0) {
        puVar29 = (undefined8 *)auStack_78;
      }
      auStack_a8 = (undefined1  [8])*puVar29;
      pCVar7 = (CapturedValues *)puVar29[1];
      do {
        tempBv3.head = (Type_conflict)pCVar7;
        pTVar22 = SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
                  ::Iterator::Data((Iterator *)auStack_a8);
        BVSparse<Memory::JitArenaAllocator>::Set(this->changedSyms,(pTVar22->key->super_Sym).m_id);
        if (tempBv3.head == (Type_conflict)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *(undefined4 *)ppBVar18 = 1;
          bVar16 = Js::Throw::ReportAssert
                             ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                              ,0x76,"(current != nullptr)","current != nullptr");
          if (!bVar16) goto LAB_004632b3;
          *(undefined4 *)ppBVar18 = 0;
        }
        pCVar7 = (CapturedValues *)(tempBv3.head)->next;
      } while ((undefined1  [8])(tempBv3.head)->next != auStack_a8);
    }
  }
  pBVar27 = (fromBlock->globOptData).maybeWrittenTypeSyms;
  if (pBVar27 != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
    if (this->maybeWrittenTypeSyms == (BVSparse<Memory::JitArenaAllocator> *)0x0) {
      pBVar27 = (BVSparse<Memory::JitArenaAllocator> *)
                new<Memory::JitArenaAllocator>(0x20,this->globOpt->alloc,0x3d6ef4);
      pJVar11 = this->globOpt->alloc;
      pBVar27->head = (Type_conflict)0x0;
      pBVar27->lastFoundIndex = (Type_conflict)0x0;
      pBVar27->alloc = pJVar11;
      pBVar27->lastUsedNodePrevNextField = (Type)pBVar27;
      this->maybeWrittenTypeSyms = pBVar27;
      BVSparse<Memory::JitArenaAllocator>::Copy<Memory::JitArenaAllocator>
                (pBVar27,(fromBlock->globOptData).maybeWrittenTypeSyms);
    }
    else {
      BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::Or>
                (this->maybeWrittenTypeSyms,pBVar27);
    }
  }
  tempBv3.lastFoundIndex = (Type_conflict)this->globOpt->tempAlloc;
  tempBv1.alloc = (Type)auStack_58;
  auStack_58 = (undefined1  [8])0x0;
  tempBv1.head = (Type_conflict)0x0;
  auStack_78 = (undefined1  [8])0x0;
  iterFrom_1.list =
       (SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount> *
       )0x0;
  iterFrom_1.current = (NodeBase *)tempBv3.lastFoundIndex;
  tempBv1.lastFoundIndex = tempBv3.lastFoundIndex;
  if (forceTypeSpecOnLoopHeader && (uVar2 & 4) != 0) {
    pLVar12 = toBlock->loop;
    BVSparse<Memory::JitArenaAllocator>::Minus
              ((BVSparse<Memory::JitArenaAllocator> *)auStack_58,
               (fromBlock->globOptData).liveInt32Syms,(fromBlock->globOptData).liveLossyInt32Syms);
    BVSparse<Memory::JitArenaAllocator>::Minus
              ((BVSparse<Memory::JitArenaAllocator> *)auStack_78,this->liveInt32Syms,
               this->liveLossyInt32Syms);
    BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::Minus>
              ((BVSparse<Memory::JitArenaAllocator> *)auStack_58,
               (BVSparse<Memory::JitArenaAllocator> *)auStack_78);
    BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::And>
              ((BVSparse<Memory::JitArenaAllocator> *)auStack_58,
               pLVar12->likelyIntSymsUsedBeforeDefined);
    BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::And>
              ((BVSparse<Memory::JitArenaAllocator> *)auStack_58,this->liveVarSyms);
    BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::Or>
              (this->liveInt32Syms,(BVSparse<Memory::JitArenaAllocator> *)auStack_58);
    BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::Minus>
              (this->liveLossyInt32Syms,(BVSparse<Memory::JitArenaAllocator> *)auStack_58);
    bVar16 = GlobOpt::DoLossyIntTypeSpec(this->globOpt);
    if (bVar16) {
      BVSparse<Memory::JitArenaAllocator>::Minus
                ((BVSparse<Memory::JitArenaAllocator> *)auStack_58,
                 (fromBlock->globOptData).liveInt32Syms,this->liveInt32Syms);
      BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::And>
                ((BVSparse<Memory::JitArenaAllocator> *)auStack_58,pLVar12->symsUsedBeforeDefined);
      BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::And>
                ((BVSparse<Memory::JitArenaAllocator> *)auStack_58,this->liveVarSyms);
      BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::Or>
                (this->liveInt32Syms,(BVSparse<Memory::JitArenaAllocator> *)auStack_58);
      BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::Or>
                (this->liveLossyInt32Syms,(BVSparse<Memory::JitArenaAllocator> *)auStack_58);
    }
    BVSparse<Memory::JitArenaAllocator>::And
              ((BVSparse<Memory::JitArenaAllocator> *)auStack_58,
               (fromBlock->globOptData).liveFloat64Syms,pLVar12->forceFloat64SymsOnEntry);
    BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::Or>
              (this->liveFloat64Syms,(BVSparse<Memory::JitArenaAllocator> *)auStack_58);
    BVSparse<Memory::JitArenaAllocator>::Minus
              ((BVSparse<Memory::JitArenaAllocator> *)auStack_58,
               (fromBlock->globOptData).liveFloat64Syms,this->liveFloat64Syms);
    BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::And>
              ((BVSparse<Memory::JitArenaAllocator> *)auStack_58,
               pLVar12->likelyNumberSymsUsedBeforeDefined);
    BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::Or>
              (this->liveFloat64Syms,(BVSparse<Memory::JitArenaAllocator> *)auStack_58);
    tempBv3.lastFoundIndex = (Type_conflict)this->globOpt->tempAlloc;
  }
  tempBv3.alloc = (Type)auStack_a8;
  auStack_a8 = (undefined1  [8])0x0;
  tempBv3.head = (Type_conflict)0x0;
  BVSparse<Memory::JitArenaAllocator>::Minus
            ((BVSparse<Memory::JitArenaAllocator> *)auStack_78,
             (fromBlock->globOptData).liveInt32Syms,(fromBlock->globOptData).liveLossyInt32Syms);
  BVSparse<Memory::JitArenaAllocator>::Minus
            ((BVSparse<Memory::JitArenaAllocator> *)auStack_58,(fromBlock->globOptData).liveVarSyms,
             (BVSparse<Memory::JitArenaAllocator> *)auStack_78);
  BVSparse<Memory::JitArenaAllocator>::Or
            ((BVSparse<Memory::JitArenaAllocator> *)auStack_78,this->liveVarSyms,this->liveInt32Syms
            );
  BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::Or>
            ((BVSparse<Memory::JitArenaAllocator> *)auStack_78,this->liveFloat64Syms);
  BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::And>
            ((BVSparse<Memory::JitArenaAllocator> *)auStack_58,
             (BVSparse<Memory::JitArenaAllocator> *)auStack_78);
  BVSparse<Memory::JitArenaAllocator>::Minus
            ((BVSparse<Memory::JitArenaAllocator> *)auStack_a8,this->liveInt32Syms,
             this->liveLossyInt32Syms);
  BVSparse<Memory::JitArenaAllocator>::Minus
            ((BVSparse<Memory::JitArenaAllocator> *)auStack_78,this->liveVarSyms,
             (BVSparse<Memory::JitArenaAllocator> *)auStack_a8);
  BVSparse<Memory::JitArenaAllocator>::Or
            ((BVSparse<Memory::JitArenaAllocator> *)auStack_a8,(fromBlock->globOptData).liveVarSyms,
             (fromBlock->globOptData).liveInt32Syms);
  BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::Or>
            ((BVSparse<Memory::JitArenaAllocator> *)auStack_a8,
             (fromBlock->globOptData).liveFloat64Syms);
  BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::And>
            ((BVSparse<Memory::JitArenaAllocator> *)auStack_78,
             (BVSparse<Memory::JitArenaAllocator> *)auStack_a8);
  iterFrom.current = (NodeBase *)this->globOpt->tempAlloc;
  auStack_d8 = (undefined1  [8])0x0;
  iterFrom.list =
       (SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
        *)0x0;
  BVSparse<Memory::JitArenaAllocator>::And
            ((BVSparse<Memory::JitArenaAllocator> *)auStack_a8,
             (BVSparse<Memory::JitArenaAllocator> *)auStack_58,
             (fromBlock->globOptData).liveFloat64Syms);
  BVSparse<Memory::JitArenaAllocator>::And
            ((BVSparse<Memory::JitArenaAllocator> *)auStack_d8,
             (BVSparse<Memory::JitArenaAllocator> *)auStack_78,this->liveFloat64Syms);
  local_b8 = (BVSparse<Memory::JitArenaAllocator> *)auStack_a8;
  BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::Or>
            (local_b8,(BVSparse<Memory::JitArenaAllocator> *)auStack_d8);
  BVSparse<Memory::JitArenaAllocator>::~BVSparse((BVSparse<Memory::JitArenaAllocator> *)auStack_d8);
  BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::Minus>
            ((BVSparse<Memory::JitArenaAllocator> *)auStack_58,
             (fromBlock->globOptData).liveFloat64Syms);
  BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::Minus>
            ((BVSparse<Memory::JitArenaAllocator> *)auStack_78,this->liveFloat64Syms);
  BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::Or>
            ((BVSparse<Memory::JitArenaAllocator> *)auStack_58,
             (BVSparse<Memory::JitArenaAllocator> *)auStack_78);
  BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::And>
            (this->liveVarSyms,(fromBlock->globOptData).liveVarSyms);
  BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::Or>
            (this->liveVarSyms,(BVSparse<Memory::JitArenaAllocator> *)auStack_58);
  tempBv1.lastUsedNodePrevNextField = (Type)__tls_get_addr(&PTR_013e5f18);
  while (local_b8 = (BVSparse<Memory::JitArenaAllocator> *)local_b8->head,
        local_b8 != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
    TVar5 = *(Type *)&local_b8->lastFoundIndex;
    auStack_d8 = (undefined1  [8])((Type *)&local_b8->alloc)->word;
    while (auStack_d8 != (undefined1  [8])0x0) {
      lVar14 = 0;
      if (auStack_d8 != (undefined1  [8])0x0) {
        for (; ((ulong)auStack_d8 >> lVar14 & 1) == 0; lVar14 = lVar14 + 1) {
        }
      }
      BVUnitT<unsigned_long>::Clear((BVUnitT<unsigned_long> *)auStack_d8,(BVIndex)lVar14);
      id = (BVIndex)lVar14 + TVar5;
      pSVar26 = SymTable::FindStackSym(this->globOpt->func->m_symTable,id);
      if (pSVar26 == (StackSym *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *(undefined4 *)tempBv1.lastUsedNodePrevNextField = 1;
        bVar16 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBlockData.cpp"
                            ,0x270,"(stackSym)","stackSym");
        if (!bVar16) goto LAB_004632b3;
        *(undefined4 *)tempBv1.lastUsedNodePrevNextField = 0;
      }
      pVVar24 = FindValue(this,&pSVar26->super_Sym);
      if (pVVar24 != (Value *)0x0) {
        this_02 = &pVVar24->valueInfo->super_ValueType;
        bVar16 = ValueType::IsInt(this_02);
        if ((bVar16) ||
           ((bVar16 = ValueType::IsLikelyInt(this_02), bVar16 &&
            (bVar16 = GlobOpt::DoAggressiveIntTypeSpec(this->globOpt), bVar16)))) {
          BVSparse<Memory::JitArenaAllocator>::Set(this->liveVarSyms,id);
        }
      }
    }
  }
  BVSparse<Memory::JitArenaAllocator>::~BVSparse((BVSparse<Memory::JitArenaAllocator> *)auStack_a8);
  BVSparse<Memory::JitArenaAllocator>::Minus
            ((BVSparse<Memory::JitArenaAllocator> *)auStack_58,this->liveInt32Syms,
             this->liveLossyInt32Syms);
  BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::Or>
            ((BVSparse<Memory::JitArenaAllocator> *)auStack_58,this->liveFloat64Syms);
  BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::And>
            ((BVSparse<Memory::JitArenaAllocator> *)auStack_58,
             (fromBlock->globOptData).liveFloat64Syms);
  BVSparse<Memory::JitArenaAllocator>::Minus
            ((BVSparse<Memory::JitArenaAllocator> *)auStack_78,
             (fromBlock->globOptData).liveInt32Syms,(fromBlock->globOptData).liveLossyInt32Syms);
  BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::Or>
            ((BVSparse<Memory::JitArenaAllocator> *)auStack_78,
             (fromBlock->globOptData).liveFloat64Syms);
  BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::And>
            ((BVSparse<Memory::JitArenaAllocator> *)auStack_78,this->liveFloat64Syms);
  BVSparse<Memory::JitArenaAllocator>::Or
            (this->liveFloat64Syms,(BVSparse<Memory::JitArenaAllocator> *)auStack_58,
             (BVSparse<Memory::JitArenaAllocator> *)auStack_78);
  BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::And>
            (this->liveInt32Syms,(fromBlock->globOptData).liveInt32Syms);
  BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::Or>
            (this->liveLossyInt32Syms,(fromBlock->globOptData).liveLossyInt32Syms);
  BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::And>
            (this->liveLossyInt32Syms,this->liveInt32Syms);
  BVSparse<Memory::JitArenaAllocator>::~BVSparse((BVSparse<Memory::JitArenaAllocator> *)auStack_78);
  BVSparse<Memory::JitArenaAllocator>::~BVSparse((BVSparse<Memory::JitArenaAllocator> *)auStack_58);
  bVar16 = GlobOpt::TrackArgumentsObject(this->globOpt);
  ppBVar18 = tempBv1.lastUsedNodePrevNextField;
  if ((bVar16) &&
     (bVar16 = BVSparse<Memory::JitArenaAllocator>::Equal
                         (this->argObjSyms,(fromBlock->globOptData).argObjSyms), !bVar16)) {
    GlobOpt::CannotAllocateArgumentsObjectOnStack(this->globOpt,(Func *)0x0);
  }
  pBVar27 = (fromBlock->globOptData).maybeTempObjectSyms;
  if ((pBVar27 == (BVSparse<Memory::JitArenaAllocator> *)0x0) ||
     (bVar16 = BVSparse<Memory::JitArenaAllocator>::IsEmpty(pBVar27), bVar16)) {
    pBVar27 = (fromBlock->globOptData).canStoreTempObjectSyms;
    if ((pBVar27 != (BVSparse<Memory::JitArenaAllocator> *)0x0) &&
       (bVar16 = BVSparse<Memory::JitArenaAllocator>::IsEmpty(pBVar27), !bVar16)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *(undefined4 *)ppBVar18 = 1;
      bVar16 = Js::Throw::ReportAssert
                         ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBlockData.cpp"
                          ,0x2b5,
                          "(!fromData->canStoreTempObjectSyms || fromData->canStoreTempObjectSyms->IsEmpty())"
                          ,
                          "!fromData->canStoreTempObjectSyms || fromData->canStoreTempObjectSyms->IsEmpty()"
                         );
      if (!bVar16) goto LAB_004632b3;
      *(undefined4 *)ppBVar18 = 0;
    }
LAB_00462ead:
    if (this->canStoreTempObjectSyms != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
      BVSparse<Memory::JitArenaAllocator>::ClearAll(this->canStoreTempObjectSyms);
    }
  }
  else {
    pBVar27 = (fromBlock->globOptData).maybeTempObjectSyms;
    if (this->maybeTempObjectSyms == (BVSparse<Memory::JitArenaAllocator> *)0x0) {
      pBVar27 = BVSparse<Memory::JitArenaAllocator>::CopyNew(pBVar27,this->globOpt->alloc);
      this->maybeTempObjectSyms = pBVar27;
    }
    else {
      BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::Or>
                (this->maybeTempObjectSyms,pBVar27);
    }
    pBVar27 = (fromBlock->globOptData).canStoreTempObjectSyms;
    if ((pBVar27 == (BVSparse<Memory::JitArenaAllocator> *)0x0) ||
       (bVar16 = BVSparse<Memory::JitArenaAllocator>::IsEmpty(pBVar27), bVar16)) goto LAB_00462ead;
    if (this->canStoreTempObjectSyms != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
      BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::And>
                (this->canStoreTempObjectSyms,(fromBlock->globOptData).canStoreTempObjectSyms);
    }
  }
  if (this->curFunc != (fromBlock->globOptData).curFunc) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *(undefined4 *)ppBVar18 = 1;
    bVar16 = Js::Throw::ReportAssert
                       ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBlockData.cpp"
                        ,700,"(this->curFunc == fromData->curFunc)",
                        "this->curFunc == fromData->curFunc");
    if (!bVar16) goto LAB_004632b3;
    *(undefined4 *)ppBVar18 = 0;
  }
  other = (fromBlock->globOptData).callSequence;
  if ((this->callSequence != (SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount> *)0x0 ||
       other != (SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount> *)0x0) &&
     (bVar16 = SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount>::Equals
                         (this->callSequence,other), !bVar16)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *(undefined4 *)ppBVar18 = 1;
    bVar16 = Js::Throw::ReportAssert
                       ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBlockData.cpp"
                        ,0x2bd,
                        "((this->callSequence == nullptr && fromData->callSequence == nullptr) || this->callSequence->Equals(*(fromData->callSequence)))"
                        ,
                        "(this->callSequence == nullptr && fromData->callSequence == nullptr) || this->callSequence->Equals(*(fromData->callSequence))"
                       );
    if (!bVar16) goto LAB_004632b3;
    *(undefined4 *)ppBVar18 = 0;
  }
  if (this->startCallCount != (fromBlock->globOptData).startCallCount) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *(undefined4 *)ppBVar18 = 1;
    bVar16 = Js::Throw::ReportAssert
                       ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBlockData.cpp"
                        ,0x2be,"(this->startCallCount == fromData->startCallCount)",
                        "this->startCallCount == fromData->startCallCount");
    if (!bVar16) goto LAB_004632b3;
    *(undefined4 *)ppBVar18 = 0;
  }
  if (this->argOutCount != (fromBlock->globOptData).argOutCount) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *(undefined4 *)ppBVar18 = 1;
    bVar16 = Js::Throw::ReportAssert
                       ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBlockData.cpp"
                        ,0x2bf,"(this->argOutCount == fromData->argOutCount)",
                        "this->argOutCount == fromData->argOutCount");
    if (!bVar16) goto LAB_004632b3;
    *(undefined4 *)ppBVar18 = 0;
  }
  if (this->totalOutParamCount != (fromBlock->globOptData).totalOutParamCount) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *(undefined4 *)ppBVar18 = 1;
    bVar16 = Js::Throw::ReportAssert
                       ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBlockData.cpp"
                        ,0x2c0,"(this->totalOutParamCount == fromData->totalOutParamCount)",
                        "this->totalOutParamCount == fromData->totalOutParamCount");
    if (!bVar16) goto LAB_004632b3;
    *(undefined4 *)ppBVar18 = 0;
  }
  if (this->inlinedArgOutSize != (fromBlock->globOptData).inlinedArgOutSize) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *(undefined4 *)ppBVar18 = 1;
    bVar16 = Js::Throw::ReportAssert
                       ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBlockData.cpp"
                        ,0x2c1,"(this->inlinedArgOutSize == fromData->inlinedArgOutSize)",
                        "this->inlinedArgOutSize == fromData->inlinedArgOutSize");
    if (!bVar16) {
LAB_004632b3:
      pcVar15 = (code *)invalidInstructionException();
      (*pcVar15)();
    }
    *(undefined4 *)ppBVar18 = 0;
  }
  pBVar28 = (fromBlock->globOptData).stackLiteralInitFldDataMap;
  if ((pBVar28 !=
       (BaseDictionary<StackSym_*,_StackLiteralInitFldData,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
        *)0x0) &&
     ((this->globOpt->prePassLoop == (Loop *)0x0 ||
      (((toBlock->field_0x18 & 4) != 0 && (toBlock->loop == this->globOpt->rootLoopPrePass)))))) {
    this_01 = this->stackLiteralInitFldDataMap;
    if (this_01 == (StackLiteralInitFldDataMap *)0x0) {
      pBVar28 = JsUtil::
                BaseDictionary<StackSym_*,_StackLiteralInitFldData,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                ::Clone(pBVar28);
      this->stackLiteralInitFldDataMap = pBVar28;
    }
    else {
      for (uVar30 = 0; uVar30 < pBVar28->bucketCount; uVar30 = uVar30 + 1) {
        iVar31 = pBVar28->buckets[uVar30];
        if (pBVar28->buckets[uVar30] != -1) {
          while (iVar31 != -1) {
            pSVar13 = pBVar28->entries;
            value = (StackLiteralInitFldData *)(pSVar13 + iVar31);
            iVar6 = pSVar13[iVar31].
                    super_DefaultHashedEntry<StackSym_*,_StackLiteralInitFldData,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                    .super_KeyValueEntry<StackSym_*,_StackLiteralInitFldData>.
                    super_ValueEntry<StackLiteralInitFldData,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<StackSym_*,_StackLiteralInitFldData>_>
                    .super_KeyValueEntryDataLayout2<StackSym_*,_StackLiteralInitFldData>.next;
            auStack_58 = (undefined1  [8])
                         pSVar13[iVar31].
                         super_DefaultHashedEntry<StackSym_*,_StackLiteralInitFldData,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                         .super_KeyValueEntry<StackSym_*,_StackLiteralInitFldData>.
                         super_ValueEntry<StackLiteralInitFldData,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<StackSym_*,_StackLiteralInitFldData>_>
                         .super_KeyValueEntryDataLayout2<StackSym_*,_StackLiteralInitFldData>.key;
            iVar17 = JsUtil::
                     BaseDictionary<StackSym*,StackLiteralInitFldData,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                     ::
                     Insert<(JsUtil::BaseDictionary<StackSym*,StackLiteralInitFldData,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)1>
                               ((BaseDictionary<StackSym*,StackLiteralInitFldData,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                                 *)this_01,(StackSym **)auStack_58,value);
            iVar31 = iVar6;
            if (iVar17 == -1) {
              bVar16 = JsUtil::
                       BaseDictionary<StackSym*,StackLiteralInitFldData,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                       ::TryGetReference<StackSym*>
                                 ((BaseDictionary<StackSym*,StackLiteralInitFldData,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                                   *)this_01,(StackSym **)auStack_58,
                                  (StackLiteralInitFldData **)auStack_78);
              if (!bVar16) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                ppBVar18 = tempBv1.lastUsedNodePrevNextField;
                *(undefined4 *)tempBv1.lastUsedNodePrevNextField = 1;
                bVar16 = Js::Throw::ReportAssert
                                   ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBlockData.cpp"
                                    ,0x2d6,"(toMap->TryGetReference(stackSym, &currentData))",
                                    "toMap->TryGetReference(stackSym, &currentData)");
                if (!bVar16) goto LAB_004632b3;
                *(undefined4 *)ppBVar18 = 0;
              }
              if (((RealCount *)((long)auStack_78 + 8))->count != value->currentInitFldCount) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                ppBVar18 = tempBv1.lastUsedNodePrevNextField;
                *(undefined4 *)tempBv1.lastUsedNodePrevNextField = 1;
                bVar16 = Js::Throw::ReportAssert
                                   ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBlockData.cpp"
                                    ,0x2d7,
                                    "(currentData->currentInitFldCount == data.currentInitFldCount)"
                                    ,"currentData->currentInitFldCount == data.currentInitFldCount")
                ;
                if (!bVar16) goto LAB_004632b3;
                *(undefined4 *)ppBVar18 = 0;
              }
              if ((PropertyIdArray *)((SListNodeBase<Memory::ArenaAllocator> *)auStack_78)->next !=
                  value->propIds) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                ppBVar18 = tempBv1.lastUsedNodePrevNextField;
                *(undefined4 *)tempBv1.lastUsedNodePrevNextField = 1;
                bVar16 = Js::Throw::ReportAssert
                                   ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBlockData.cpp"
                                    ,0x2d8,"(currentData->propIds == data.propIds)",
                                    "currentData->propIds == data.propIds");
                if (!bVar16) goto LAB_004632b3;
                *(undefined4 *)ppBVar18 = 0;
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void
GlobOptBlockData::MergeBlockData(
    BasicBlock *toBlock,
    BasicBlock *fromBlock,
    BVSparse<JitArenaAllocator> *const symsRequiringCompensation,
    BVSparse<JitArenaAllocator> *const symsCreatedForMerge,
    bool forceTypeSpecOnLoopHeader)
{
    GlobOptBlockData *fromData = &(fromBlock->globOptData);

    if(this->globOpt->DoBoundCheckHoist())
    {
        // Do this before merging values so that it can see whether a sym's value was changed on one side or the other
        this->globOpt->MergeBoundCheckHoistBlockData(toBlock, this, fromBlock, fromData);
    }

    bool isLoopBackEdge = toBlock->isLoopHeader;
    this->MergeValueMaps(toBlock, fromBlock, symsRequiringCompensation, symsCreatedForMerge);

    this->globOpt->InsertCloneStrs(toBlock, this, fromData);

    this->liveFields->And(fromData->liveFields);
    this->liveArrayValues->And(fromData->liveArrayValues);
    this->isTempSrc->And(fromData->isTempSrc);
    this->hasCSECandidates &= fromData->hasCSECandidates;

    this->changedSyms->Or(fromData->changedSyms);
    if (this->capturedValues == nullptr)
    {
        this->capturedValues = fromData->capturedValues;
        if (this->capturedValues)
        {
            this->capturedValues->IncrementRefCount();
        }
    }
    else
    {
        this->MergeCapturedValues(
            &this->capturedValues->constantValues,
            fromData->capturedValues == nullptr ? nullptr : &fromData->capturedValues->constantValues,
            [&](ConstantStackSymValue * symValueFrom, ConstantStackSymValue * symValueTo)
            {
                Assert(symValueFrom->Key()->m_id == symValueTo->Key()->m_id);
                return symValueFrom->Value().IsEqual(symValueTo->Value());
            });

        this->MergeCapturedValues(
            &this->capturedValues->copyPropSyms,
            fromData->capturedValues == nullptr ? nullptr : &fromData->capturedValues->copyPropSyms,
            [&](CopyPropSyms * copyPropSymFrom, CopyPropSyms * copyPropSymTo)
            {
                Assert(copyPropSymFrom->Key()->m_id == copyPropSymTo->Key()->m_id);
                if (copyPropSymFrom->Value()->m_id == copyPropSymTo->Value()->m_id)
                {
                    Value * fromVal = fromData->FindValue(copyPropSymFrom->Key());
                    Value * toVal = this->FindValue(copyPropSymFrom->Key());
                    return fromVal && toVal && fromVal->IsEqualTo(toVal);
                }
                return false;
            });
    }

    if (fromData->maybeWrittenTypeSyms)
    {
        if (this->maybeWrittenTypeSyms == nullptr)
        {
            this->maybeWrittenTypeSyms = JitAnew(this->globOpt->alloc, BVSparse<JitArenaAllocator>, this->globOpt->alloc);
            this->maybeWrittenTypeSyms->Copy(fromData->maybeWrittenTypeSyms);
        }
        else
        {
            this->maybeWrittenTypeSyms->Or(fromData->maybeWrittenTypeSyms);
        }
    }

    {
        // - Keep the var sym live if any of the following is true:
        //     - The var sym is live on both sides
        //     - The var sym is the only live sym that contains the lossless value of the sym on a side (that is, the lossless
        //       int32 sym is not live, and the float64 sym is not live on that side), and the sym of any type is live on the
        //       other side
        //     - On a side, the var and float64 syms are live, the lossless int32 sym is not live, the sym's merged value is
        //       likely int, and the sym of any type is live on the other side. Since the value is likely int, it may be
        //       int-specialized (with lossless conversion) later. Keeping only the float64 sym live requires doing a lossless
        //       conversion from float64 to int32, with bailout if the value of the float is not a true 32-bit integer. Checking
        //       that is costly, and if the float64 sym is converted back to var, it does not become a tagged int, causing a
        //       guaranteed bailout if a lossless conversion to int happens later. Keep the var sym live to preserve its
        //       tagged-ness so that it can be int-specialized while avoiding unnecessary bailouts.
        // - Keep the int32 sym live if it's live on both sides
        //     - Mark the sym as lossy if it's lossy on any side
        // - Keep the float64 sym live if it's live on a side and the sym of a specialized lossless type is live on the other
        //   side
        //
        // fromData.temp =
        //     (fromData.var - (fromData.int32 - fromData.lossyInt32)) &
        //     (this.var | this.int32 | this.float64)
        // this.temp =
        //     (this.var - (this.int32 - this.lossyInt32)) &
        //     (fromData.var | fromData.int32 | fromData.float64)
        // this.var =
        //     (fromData.var & this.var) |
        //     (fromData.temp - fromData.float64) |
        //     (this.temp - this.float64) |
        //     (fromData.temp & fromData.float64 | this.temp & this.float64) & (value ~ int)
        //
        // this.float64 =
        //     fromData.float64 & ((this.int32 - this.lossyInt32) | this.float64) |
        //     this.float64 & ((fromData.int32 - fromData.lossyInt32) | fromData.float64)
        // this.int32 &= fromData.int32
        // this.lossyInt32 = (fromData.lossyInt32 | this.lossyInt32) & this.int32

        BVSparse<JitArenaAllocator> tempBv1(this->globOpt->tempAlloc);
        BVSparse<JitArenaAllocator> tempBv2(this->globOpt->tempAlloc);

        if (isLoopBackEdge && forceTypeSpecOnLoopHeader)
        {
            Loop *const loop = toBlock->loop;

            // Force to lossless int32:
            // forceLosslessInt32 =
            //     ((fromData.int32 - fromData.lossyInt32) - (this.int32 - this.lossyInt32)) &
            //     loop.likelyIntSymsUsedBeforeDefined &
            //     this.var
            tempBv1.Minus(fromData->liveInt32Syms, fromData->liveLossyInt32Syms);
            tempBv2.Minus(this->liveInt32Syms, this->liveLossyInt32Syms);
            tempBv1.Minus(&tempBv2);
            tempBv1.And(loop->likelyIntSymsUsedBeforeDefined);
            tempBv1.And(this->liveVarSyms);
            this->liveInt32Syms->Or(&tempBv1);
            this->liveLossyInt32Syms->Minus(&tempBv1);

            if(this->globOpt->DoLossyIntTypeSpec())
            {
                // Force to lossy int32:
                // forceLossyInt32 = (fromData.int32 - this.int32) & loop.symsUsedBeforeDefined & this.var
                tempBv1.Minus(fromData->liveInt32Syms, this->liveInt32Syms);
                tempBv1.And(loop->symsUsedBeforeDefined);
                tempBv1.And(this->liveVarSyms);
                this->liveInt32Syms->Or(&tempBv1);
                this->liveLossyInt32Syms->Or(&tempBv1);
            }

            // Force to float64:
            // forceFloat64 =
            //     fromData.float64 & loop.forceFloat64 |
            //     (fromData.float64 - this.float64) & loop.likelyNumberSymsUsedBeforeDefined
            tempBv1.And(fromData->liveFloat64Syms, loop->forceFloat64SymsOnEntry);
            this->liveFloat64Syms->Or(&tempBv1);
            tempBv1.Minus(fromData->liveFloat64Syms, this->liveFloat64Syms);
            tempBv1.And(loop->likelyNumberSymsUsedBeforeDefined);
            this->liveFloat64Syms->Or(&tempBv1);
        }

        {
            BVSparse<JitArenaAllocator> tempBv3(this->globOpt->tempAlloc);

            // fromData.temp =
            //     (fromData.var - (fromData.int32 - fromData.lossyInt32)) &
            //     (this.var | this.int32 | this.float64)
            tempBv2.Minus(fromData->liveInt32Syms, fromData->liveLossyInt32Syms);
            tempBv1.Minus(fromData->liveVarSyms, &tempBv2);
            tempBv2.Or(this->liveVarSyms, this->liveInt32Syms);
            tempBv2.Or(this->liveFloat64Syms);
            tempBv1.And(&tempBv2);

            // this.temp =
            //     (this.var - (this.int32 - this.lossyInt32)) &
            //     (fromData.var | fromData.int32 | fromData.float64)
            tempBv3.Minus(this->liveInt32Syms, this->liveLossyInt32Syms);
            tempBv2.Minus(this->liveVarSyms, &tempBv3);
            tempBv3.Or(fromData->liveVarSyms, fromData->liveInt32Syms);
            tempBv3.Or(fromData->liveFloat64Syms);
            tempBv2.And(&tempBv3);

            {
                BVSparse<JitArenaAllocator> tempBv4(this->globOpt->tempAlloc);

                // fromData.temp & fromData.float64 | this.temp & this.float64
                tempBv3.And(&tempBv1, fromData->liveFloat64Syms);
                tempBv4.And(&tempBv2, this->liveFloat64Syms);
                tempBv3.Or(&tempBv4);
            }

            //     (fromData.temp - fromData.float64) |
            //     (this.temp - this.float64)
            tempBv1.Minus(fromData->liveFloat64Syms);
            tempBv2.Minus(this->liveFloat64Syms);
            tempBv1.Or(&tempBv2);

            // this.var =
            //     (fromData.var & this.var) |
            //     (fromData.temp - fromData.float64) |
            //     (this.temp - this.float64)
            this->liveVarSyms->And(fromData->liveVarSyms);
            this->liveVarSyms->Or(&tempBv1);

            // this.var |=
            //     (fromData.temp & fromData.float64 | this.temp & this.float64) & (value ~ int)
            FOREACH_BITSET_IN_SPARSEBV(id, &tempBv3)
            {
                StackSym *const stackSym = this->globOpt->func->m_symTable->FindStackSym(id);
                Assert(stackSym);
                Value *const value = this->FindValue(stackSym);
                if(value)
                {
                    ValueInfo *const valueInfo = value->GetValueInfo();
                    if(valueInfo->IsInt() || (valueInfo->IsLikelyInt() && this->globOpt->DoAggressiveIntTypeSpec()))
                    {
                        this->liveVarSyms->Set(id);
                    }
                }
            } NEXT_BITSET_IN_SPARSEBV;
        }

        //     fromData.float64 & ((this.int32 - this.lossyInt32) | this.float64)
        tempBv1.Minus(this->liveInt32Syms, this->liveLossyInt32Syms);
        tempBv1.Or(this->liveFloat64Syms);
        tempBv1.And(fromData->liveFloat64Syms);

        //     this.float64 & ((fromData.int32 - fromData.lossyInt32) | fromData.float64)
        tempBv2.Minus(fromData->liveInt32Syms, fromData->liveLossyInt32Syms);
        tempBv2.Or(fromData->liveFloat64Syms);
        tempBv2.And(this->liveFloat64Syms);

        // this.float64 =
        //     fromData.float64 & ((this.int32 - this.lossyInt32) | this.float64) |
        //     this.float64 & ((fromData.int32 - fromData.lossyInt32) | fromData.float64)
        this->liveFloat64Syms->Or(&tempBv1, &tempBv2);

        // this.int32 &= fromData.int32
        // this.lossyInt32 = (fromData.lossyInt32 | this.lossyInt32) & this.int32
        this->liveInt32Syms->And(fromData->liveInt32Syms);
        this->liveLossyInt32Syms->Or(fromData->liveLossyInt32Syms);
        this->liveLossyInt32Syms->And(this->liveInt32Syms);
    }

    if (this->globOpt->TrackArgumentsObject())
    {
        if (!this->argObjSyms->Equal(fromData->argObjSyms))
        {
            this->globOpt->CannotAllocateArgumentsObjectOnStack(nullptr);
        }
    }

    if (fromData->maybeTempObjectSyms && !fromData->maybeTempObjectSyms->IsEmpty())
    {
        if (this->maybeTempObjectSyms)
        {
            this->maybeTempObjectSyms->Or(fromData->maybeTempObjectSyms);
        }
        else
        {
            this->maybeTempObjectSyms = fromData->maybeTempObjectSyms->CopyNew(this->globOpt->alloc);
        }

        if (fromData->canStoreTempObjectSyms && !fromData->canStoreTempObjectSyms->IsEmpty())
        {
            if (this->canStoreTempObjectSyms)
            {
                // Both need to be temp object
                this->canStoreTempObjectSyms->And(fromData->canStoreTempObjectSyms);
            }
        }
        else if (this->canStoreTempObjectSyms)
        {
            this->canStoreTempObjectSyms->ClearAll();
        }
    }
    else
    {
        Assert(!fromData->canStoreTempObjectSyms || fromData->canStoreTempObjectSyms->IsEmpty());
        if (this->canStoreTempObjectSyms)
        {
            this->canStoreTempObjectSyms->ClearAll();
        }
    }

    Assert(this->curFunc == fromData->curFunc);
    Assert((this->callSequence == nullptr && fromData->callSequence == nullptr) || this->callSequence->Equals(*(fromData->callSequence)));
    Assert(this->startCallCount == fromData->startCallCount);
    Assert(this->argOutCount == fromData->argOutCount);
    Assert(this->totalOutParamCount == fromData->totalOutParamCount);
    Assert(this->inlinedArgOutSize == fromData->inlinedArgOutSize);

    // stackLiteralInitFldDataMap is a union of the stack literal from two path.
    // Although we don't need the data on loop prepass, we need to do it for the loop header
    // because we capture the loop header bailout on loop prepass.
    if (fromData->stackLiteralInitFldDataMap != nullptr &&
        (!this->globOpt->IsLoopPrePass() || (toBlock->isLoopHeader && toBlock->loop == this->globOpt->rootLoopPrePass)))
    {
        if (this->stackLiteralInitFldDataMap == nullptr)
        {
            this->stackLiteralInitFldDataMap = fromData->stackLiteralInitFldDataMap->Clone();
        }
        else
        {
            StackLiteralInitFldDataMap * toMap = this->stackLiteralInitFldDataMap;
            fromData->stackLiteralInitFldDataMap->Map([toMap](StackSym * stackSym, StackLiteralInitFldData const& data)
            {
                if (toMap->AddNew(stackSym, data) == -1)
                {
                    // If there is an existing data for the stackSym, both path should match
                    DebugOnly(StackLiteralInitFldData const * currentData);
                    Assert(toMap->TryGetReference(stackSym, &currentData));
                    Assert(currentData->currentInitFldCount == data.currentInitFldCount);
                    Assert(currentData->propIds == data.propIds);
                }
            });
        }
    }
}